

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy-mpi.c
# Opt level: O0

void server(void)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 local_58 [8];
  int64_t work_1 [2];
  int i;
  int result;
  MPI_Status status;
  int64_t work [2];
  int64_t offset;
  int64_t chunksize;
  
  iVar2 = bb.nmemb;
  sVar1 = buffersize;
  iVar3 = big_file_dtype_itemsize(bb.dtype);
  offset = sVar1 / (ulong)(long)(iVar2 * iVar3);
  work[1] = 0;
  while ((ulong)work[1] < bb.size) {
    work_1[1]._4_4_ = 0;
    MPI_Recv((long)work_1 + 0xc,1,&ompi_mpi_int,0xffffffff,0xffffffff,&ompi_mpi_comm_world,&i);
    if (result == 0x50f) break;
    if (bb.size < (ulong)(work[1] + offset)) {
      offset = bb.size - work[1];
    }
    status._ucount = work[1];
    MPI_Send(&status._ucount,1,MPI_TYPE_WORK,i,0x50b,&ompi_mpi_comm_world);
    work[1] = offset + work[1];
    if (verbose != 0) {
      auVar4._8_4_ = (int)(bb.size >> 0x20);
      auVar4._0_8_ = bb.size;
      auVar4._12_4_ = 0x45300000;
      fprintf(_stderr,"%ld / %td done (%0.4g%%)\r",
              (100.0 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)bb.size) - 4503599627370496.0))) *
              (double)work[1],work[1]);
    }
  }
  for (work_1[1]._0_4_ = 1; (int)work_1[1] < NTask; work_1[1]._0_4_ = (int)work_1[1] + 1) {
    MPI_Send(local_58,1,MPI_TYPE_WORK,(int)work_1[1],0x50a,&ompi_mpi_comm_world);
  }
  return;
}

Assistant:

void server() {
    int64_t chunksize = buffersize / (bb.nmemb * dtype_itemsize(bb.dtype));
    int64_t offset;
    int64_t work[2];
    for(offset = 0; offset < bb.size; ) {
        MPI_Status status;
        int result = 0;
        MPI_Recv(&result, 1, MPI_INT, MPI_ANY_SOURCE, MPI_ANY_TAG, MPI_COMM_WORLD,
                &status);
        if(status.MPI_TAG == ERROR_TAG) {
            break;
        }

        /* never read beyond my end (read_simple caps at EOF) */
        if(offset + chunksize > bb.size) {
            chunksize = bb.size - offset;
        }
        work[0] = offset;
        work[1] = chunksize;
        MPI_Send(work, 1, MPI_TYPE_WORK, status.MPI_SOURCE, WORK_TAG, MPI_COMM_WORLD);

        offset += chunksize;
        if(verbose) {
            fprintf(stderr, "%ld / %td done (%0.4g%%)\r", offset, bb.size, (100. / bb.size) * offset);
        }
    }
    int i;
    for(i = 1; i < NTask; i ++) {
        int64_t work[2];
        MPI_Send(work, 1, MPI_TYPE_WORK, i, DIE_TAG, MPI_COMM_WORLD);
    }

}